

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

InterchangeObject * __thiscall
ASDCP::MXF::InterchangeObject::InitFromTLVSet(InterchangeObject *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  InterchangeObject *this_local;
  Result_t *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  TLVSet_local = TLVSet;
  this_local = this;
  pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                            MDD_InterchangeObject_InstanceUID);
  TLVReader::ReadObject((TLVReader *)this,in_RDX,(IArchive *)pMVar2);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_GenerationInterchangeObject_GenerationUID);
    optional_property<Kumu::UUID>::get
              ((optional_property<Kumu::UUID> *)
               &TLVSet[1].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    TLVReader::ReadObject(&local_a0,local_20,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::InterchangeObject::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = TLVSet.ReadObject(OBJ_READ_ARGS(InterchangeObject, InstanceUID));
  if ( ASDCP_SUCCESS(result) )
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(GenerationInterchangeObject, GenerationUID));
  return result;
}